

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O3

int __thiscall Pl_PNGFilter::PaethPredictor(Pl_PNGFilter *this,int a,int b,int c)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = (b + a) - c;
  uVar4 = iVar2 - a;
  uVar1 = -uVar4;
  if (0 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar5 = iVar2 - b;
  uVar4 = -uVar5;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar3 = iVar2 - c;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  if (uVar5 < uVar4) {
    b = c;
  }
  if (uVar5 < uVar1) {
    a = b;
  }
  if (uVar4 < uVar1) {
    a = b;
  }
  return a;
}

Assistant:

int
Pl_PNGFilter::PaethPredictor(int a, int b, int c)
{
    int p = a + b - c;
    int pa = abs_diff(p, a);
    int pb = abs_diff(p, b);
    int pc = abs_diff(p, c);

    if (pa <= pb && pa <= pc) {
        return a;
    }
    if (pb <= pc) {
        return b;
    }
    return c;
}